

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::DefaultSampling<float>::genFixeds
          (DefaultSampling<float> *this,FloatFormat *format,
          vector<float,_std::allocator<float>_> *dst)

{
  int __exponent;
  int iVar1;
  int sign;
  int iVar2;
  float fVar3;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  iVar2 = format->m_minExp;
  __exponent = format->m_maxExp;
  iVar1 = format->m_fractionBits;
  local_34 = ldexpf(1.0,iVar2 - iVar1);
  local_38 = ldexpf(1.0,iVar2);
  local_28 = ldexpf(1.0,__exponent - iVar1);
  local_40 = NAN;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
  local_40 = 0.0;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
  local_2c = local_38 - local_34;
  local_30 = local_34 + local_38;
  for (iVar2 = -1; iVar2 < 2; iVar2 = iVar2 + 2) {
    local_3c = (float)iVar2;
    local_40 = local_34 * local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_2c * local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_38 * local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_30 * local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_3c * 0.5;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_3c + local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_24 = ldexpf(1.0,__exponent);
    fVar3 = ldexpf(1.0,__exponent);
    local_40 = ((fVar3 - local_28) + local_24) * local_3c;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
    local_40 = local_3c * INFINITY;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(dst,&local_40);
  }
  return;
}

Assistant:

void DefaultSampling<float>::genFixeds (const FloatFormat& format, vector<float>& dst) const
{
	const int			minExp			= format.getMinExp();
	const int			maxExp			= format.getMaxExp();
	const int			fractionBits	= format.getFractionBits();
	const float			minQuantum		= deFloatLdExp(1.0f, minExp - fractionBits);
	const float			minNormalized	= deFloatLdExp(1.0f, minExp);
	const float			maxQuantum		= deFloatLdExp(1.0f, maxExp - fractionBits);

	// NaN
	dst.push_back(TCU_NAN);
	// Zero
	dst.push_back(0.0f);

	for (int sign = -1; sign <= 1; sign += 2)
	{
		// Smallest subnormal
		dst.push_back((float)sign * minQuantum);

		// Largest subnormal
		dst.push_back((float)sign * (minNormalized - minQuantum));

		// Smallest normalized
		dst.push_back((float)sign * minNormalized);

		// Next smallest normalized
		dst.push_back((float)sign * (minNormalized + minQuantum));

		dst.push_back((float)sign * 0.5f);
		dst.push_back((float)sign * 1.0f);
		dst.push_back((float)sign * 2.0f);

		// Largest number
		dst.push_back((float)sign * (deFloatLdExp(1.0f, maxExp) +
									(deFloatLdExp(1.0f, maxExp) - maxQuantum)));

		dst.push_back((float)sign * TCU_INFINITY);
	}
}